

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCas<(moira::Core)2,(moira::Instr)143,(moira::Mode)3,1>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  u32 data;
  u32 ea;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  uVar4 = (ulong)(uVar1 & 7);
  readExt<(moira::Core)2>(this);
  readOp<(moira::Core)2,(moira::Mode)3,1,0ull>(this,opcode & 7,&ea,&data);
  uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar4 * 4);
  cmp<(moira::Core)2,1>(this,uVar2 & 0xff,data);
  if ((this->reg).sr.z == false) {
    *(uint *)((long)&(this->reg).field_3 + uVar4 * 4) = uVar2 & 0xffffff00 | data;
    iVar3 = 0x10;
  }
  else {
    write<(moira::Core)2,(moira::AddrSpace)1,1,0ull>
              (this,ea,(uint)*(byte *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 4 & 0x1c)));
    iVar3 = 0x13;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar3 + this->cp));
  prefetch<(moira::Core)2,4ull>(this);
  return;
}

Assistant:

void
Moira::execCas(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    int dst = _____________xxx(opcode);
    int dc  = _____________xxx(queue.irc);
    int du  = _______xxx______(queue.irc);

    u32 ea, data;

    readExt<C>();
    readOp<C, M, S, STD_AE_FRAME>(dst, &ea, &data);

    auto compare = readD(dc);

    // Set flags
    cmp<C, S>(CLIP<S>(compare), data);

    if (!reg.sr.z) {

        writeD(dc, CLEAR<S>(compare) | data);

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PD   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_DI   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_IX   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AW   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_AL   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)

    } else {

        writeM<C, M, S>(ea, readD<S>(du));

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PD   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_DI   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_IX   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AW   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AL   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
    }

    prefetch<C, POLL>();

    FINALIZE
}